

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O2

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  int override;
  int check_ambiguity;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  size_t sVar6;
  char **ppcVar7;
  char *pcVar8;
  uint uVar9;
  uint *prev_given;
  ulong uVar10;
  uint *field_given;
  option *poVar11;
  option *poVar12;
  custom_getopt_data *d;
  uint uVar13;
  char **possible_values;
  uint uVar14;
  size_t sVar15;
  char cVar16;
  option *poVar17;
  ulong uVar18;
  char *pcVar19;
  cmdline_parser_arg_type arg_type;
  int no_free;
  char *pcVar20;
  char short_opt;
  int iVar21;
  uint local_1b0;
  gengetopt_args_info local_args_info;
  
  package_name = *argv;
  override = params->override;
  check_ambiguity = params->check_ambiguity;
  d = (custom_getopt_data *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  cmdline_parser_init(&local_args_info);
  uVar3 = (ulong)(uint)argc;
  pcVar8 = (char *)0x0;
  uVar18 = 0;
  iVar21 = params->print_errors;
  uVar13 = argc;
  do {
    custom_opterr = iVar21;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (uint)uVar18;
    uVar14 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    if (argc < 1) goto LAB_0012dac4;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (char *)0x0;
    custom_optarg = pcVar8;
    iVar21 = custom_opterr;
    if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
       ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012d484:
      if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
          (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
      }
      else {
        exchange(argv,d);
      }
      uVar18 = (ulong)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      uVar14 = argc;
      if (argc < (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
        uVar14 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      uVar10 = uVar3;
      if ((long)uVar3 < (long)uVar18) {
        uVar10 = uVar18;
      }
      for (; local_1b0 = (uint)uVar10, _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = uVar14
          , (long)uVar18 < (long)uVar3; uVar18 = uVar18 + 1) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = (uint)uVar18;
        if ((*argv[uVar18] == '-') &&
           (local_1b0 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7,
           argv[uVar18][1] != '\0')) break;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
      }
      uVar9 = argc;
      if ((((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 == argc) ||
           (pcVar8 = argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7],
           uVar9 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7, *pcVar8 != '-')) ||
          (pcVar8[1] != '-')) || (pcVar8[2] != '\0')) {
        if (local_1b0 != argc) {
          lVar4 = (long)(int)local_1b0;
          pcVar8 = argv[lVar4];
          if ((*pcVar8 != '-') || (pcVar8[1] == '\0')) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_1b0 + 1;
            uVar10 = 1;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar8;
            goto switchD_0012d7e8_caseD_63;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
               pcVar8 + (ulong)(pcVar8[1] == '-') + 1;
          argc = uVar13;
          goto LAB_0012d589;
        }
      }
      else {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
        uVar13 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
          exchange(argv,d);
          uVar13 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = uVar13;
        uVar18 = (ulong)(uint)argc;
        uVar9 = argc;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = argc;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
      }
      uVar14 = (uint)uVar18;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != uVar9) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
        uVar14 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      }
      goto LAB_0012dac4;
    }
    if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (char *)0x0) ||
       (*_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == '\0')) goto LAB_0012d484;
    lVar4 = (long)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    argc = uVar13;
    local_1b0 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_0012d589:
    pcVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    pcVar8 = argv[lVar4];
    if (pcVar8[1] == '-') {
      for (sVar15 = 0;
          (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar15] != '\0' &&
          (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar15] != '='));
          sVar15 = sVar15 + 1) {
      }
      bVar1 = false;
      poVar11 = (option *)0x0;
      for (poVar17 = cmdline_parser_internal::long_options; pcVar20 = poVar17->name,
          pcVar20 != (char *)0x0; poVar17 = poVar17 + 1) {
        iVar2 = strncmp(pcVar20,pcVar19,sVar15);
        poVar12 = poVar11;
        if (iVar2 == 0) {
          sVar6 = strlen(pcVar20);
          if ((int)sVar6 == (int)sVar15) goto LAB_0012d6c0;
          poVar12 = poVar17;
          if ((poVar11 != (option *)0x0) &&
             (((poVar11->has_arg != poVar17->has_arg || (poVar11->flag != poVar17->flag)) ||
              (poVar12 = poVar11, poVar11->val != poVar17->val)))) {
            bVar1 = true;
            poVar12 = poVar11;
          }
        }
        poVar11 = poVar12;
      }
      if (bVar1) {
        if (iVar21 != 0) {
          fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar8);
          local_1b0 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          pcVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
        }
        sVar15 = strlen(pcVar19);
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar19 + sVar15;
LAB_0012d9fa:
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_1b0 + 1;
      }
      else {
        poVar17 = poVar11;
        if (poVar11 == (option *)0x0) {
          if (iVar21 != 0) {
            fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar19);
            local_1b0 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = "";
          goto LAB_0012d9fa;
        }
LAB_0012d6c0:
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_1b0 + 1;
        uVar18 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (pcVar19[sVar15] == '\0') {
          if (poVar17->has_arg == 1) {
            if (argc <= (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
              if (iVar21 != 0) {
                fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar8);
                pcVar19 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              }
              sVar15 = strlen(pcVar19);
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar19 + sVar15;
              goto LAB_0012da63;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                 argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
            uVar18 = (ulong)(local_1b0 + 2);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_1b0 + 2;
          }
LAB_0012d723:
          short_opt = '+';
          uVar13 = argc;
          sVar15 = strlen(pcVar19);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar19 + sVar15;
          uVar10 = (ulong)(uint)poVar17->val;
          if ((uint *)poVar17->flag == (uint *)0x0) goto LAB_0012d7be;
          *poVar17->flag = poVar17->val;
        }
        else {
          if (poVar17->has_arg != 0) {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar19 + sVar15 + 1;
            goto LAB_0012d723;
          }
          if (iVar21 != 0) {
            if (pcVar8[1] == '-') {
              fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,poVar17->name)
              ;
            }
            else {
              fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                      (ulong)(uint)(int)*pcVar8,poVar17->name);
            }
          }
          pcVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
          sVar15 = strlen(_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar8 + sVar15;
        }
      }
LAB_0012da63:
      custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
LAB_0012da71:
      cmdline_parser_release(&local_args_info);
      return 1;
    }
    pcVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 + 1;
    cVar16 = *_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
    uVar14 = (uint)cVar16;
    uVar10 = (ulong)uVar14;
    short_opt = -0x2d;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar8;
    pvVar5 = memchr("hVi:bm:n:d:",uVar14,0xc);
    if (pcVar19[1] == '\0') {
      local_1b0 = local_1b0 + 1;
      uVar18 = (ulong)local_1b0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_1b0;
    }
    if ((pvVar5 == (void *)0x0) || (cVar16 == ':')) {
      if (iVar21 != 0) {
        fprintf(_stderr,"%s: invalid option -- %c\n",*argv,uVar10);
      }
      goto LAB_0012da63;
    }
    uVar13 = argc;
    if (*(char *)((long)pvVar5 + 1) == ':') {
      if (*(char *)((long)pvVar5 + 2) == ':') {
        if (*pcVar8 == '\0') {
          pcVar8 = (char *)0x0;
        }
        else {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_1b0 + 1;
          uVar18 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar8;
      }
      else {
        if (*pcVar8 == '\0') {
          if (local_1b0 == argc) {
            cVar16 = '?';
            if (iVar21 == 0) {
              iVar21 = 0;
            }
            else {
              short_opt = 'Q';
              fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar14);
              uVar18 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
              iVar21 = custom_opterr;
            }
          }
          else {
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_1b0 + 1;
            uVar18 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = argv[(int)local_1b0];
          }
        }
        else {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = local_1b0 + 1;
          uVar18 = (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar8;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
        uVar10 = (ulong)(uint)(int)cVar16;
        uVar13 = argc;
      }
    }
LAB_0012d7be:
    pcVar8 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar2 = (int)uVar10;
    switch(iVar2) {
    case 0x62:
      d = (custom_getopt_data *)0x0;
      possible_values = (char **)0x0;
      pcVar20 = (char *)0x62;
      iVar2 = 0x244f43;
      no_free = 1;
      arg_type = ARG_FLAG;
      prev_given = &local_args_info.box_given;
      field_given = &args_info->box_given;
      ppcVar7 = (char **)&args_info->box_flag;
      break;
    case 99:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
      goto switchD_0012d7e8_caseD_63;
    case 100:
      possible_values = (char **)0x0;
      pcVar20 = (char *)0x64;
      iVar2 = 0x2431da;
      no_free = 0;
      arg_type = ARG_DOUBLE;
      prev_given = &local_args_info.delta_given;
      field_given = &args_info->delta_given;
      d = (custom_getopt_data *)&args_info->delta_orig;
      ppcVar7 = (char **)&args_info->delta_arg;
      break;
    case 0x68:
      cmdline_parser_print_help();
LAB_0012dc76:
      cmdline_parser_free(&local_args_info);
      exit(0);
    case 0x69:
      possible_values = (char **)0x0;
      pcVar20 = (char *)0x69;
      iVar2 = 0x2431c5;
      prev_given = &local_args_info.input_given;
      field_given = &args_info->input_given;
      d = (custom_getopt_data *)&args_info->input_orig;
      ppcVar7 = &args_info->input_arg;
      goto LAB_0012d8c9;
    case 0x6d:
      possible_values = cmdline_parser_method_values;
      pcVar20 = (char *)0x6d;
      iVar2 = 0x2431cb;
      prev_given = &local_args_info.method_given;
      field_given = &args_info->method_given;
      d = (custom_getopt_data *)&args_info->method_orig;
      ppcVar7 = &args_info->method_arg;
LAB_0012d8c9:
      no_free = 0;
      arg_type = ARG_STRING;
      break;
    case 0x6e:
      possible_values = (char **)0x0;
      pcVar20 = (char *)0x6e;
      iVar2 = 0x2431d2;
      no_free = 0;
      arg_type = ARG_INT;
      pcVar19 = "25";
      prev_given = &local_args_info.npoints_given;
      field_given = &args_info->npoints_given;
      d = (custom_getopt_data *)&args_info->npoints_orig;
      ppcVar7 = (char **)&args_info->npoints_arg;
      goto LAB_0012d8d8;
    default:
      uVar14 = (uint)uVar18;
      if (iVar2 == -1) {
LAB_0012dac4:
        custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        cmdline_parser_release(&local_args_info);
        uVar13 = argc - uVar14;
        if (uVar13 == 0 || argc < (int)uVar14) {
          return 0;
        }
        args_info->inputs_num = uVar13;
        ppcVar7 = (char **)malloc((ulong)uVar13 << 3);
        args_info->inputs = ppcVar7;
        for (lVar4 = 0; (int)uVar14 + lVar4 < (long)argc; lVar4 = lVar4 + 1) {
          pcVar8 = gengetopt_strdup(argv[(int)uVar14 + lVar4]);
          args_info->inputs[lVar4] = pcVar8;
        }
        return 0;
      }
      if ((iVar2 != 0) && (iVar2 != 0x3f)) {
        if (iVar2 == 0x56) {
          cmdline_parser_print_version();
          goto LAB_0012dc76;
        }
switchD_0012d7e8_caseD_63:
        custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        fprintf(_stderr,"%s: option unknown: %c%s\n","elasticConstants",uVar10,"");
        abort();
      }
      goto LAB_0012da71;
    }
    pcVar19 = (char *)0x0;
LAB_0012d8d8:
    iVar2 = update_arg(ppcVar7,(char **)d,field_given,prev_given,
                       _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3,possible_values,pcVar19,
                       arg_type,check_ambiguity,override,no_free,iVar2,pcVar20,short_opt,
                       (char *)CONCAT44(uVar13,iVar21));
    if (iVar2 != 0) goto LAB_0012da71;
  } while( true );
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  override = params->override;
  initialize = params->initialize;
  check_required = params->check_required;
  FIX_UNUSED(check_required);
  check_ambiguity = params->check_ambiguity;

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "box",	0, NULL, 'b' },
        { "method",	1, NULL, 'm' },
        { "npoints",	1, NULL, 'n' },
        { "delta",	1, NULL, 'd' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:bm:n:d:", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* Input file name.  */
        
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'b':	/* Optimize box geometry before performing calculation.  */
        
        
          if (update_arg((void *)&(args_info->box_flag), 0, &(args_info->box_given),
              &(local_args_info.box_given), optarg, 0, 0, ARG_FLAG,
              check_ambiguity, override, 1, 0, "box", 'b',
              additional_error))
            goto failure;
        
          break;
        case 'm':	/* Calculation Method.  */
        
        
          if (update_arg( (void *)&(args_info->method_arg), 
               &(args_info->method_orig), &(args_info->method_given),
              &(local_args_info.method_given), optarg, cmdline_parser_method_values, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "method", 'm',
              additional_error))
            goto failure;
        
          break;
        case 'n':	/* number of points for fitting
        stress-strain relationship.  */
        
        
          if (update_arg( (void *)&(args_info->npoints_arg), 
               &(args_info->npoints_orig), &(args_info->npoints_given),
              &(local_args_info.npoints_given), optarg, 0, "25", ARG_INT,
              check_ambiguity, override, 0, 0,
              "npoints", 'n',
              additional_error))
            goto failure;
        
          break;
        case 'd':	/* size of relative volume changes for strains.  */
        
        
          if (update_arg( (void *)&(args_info->delta_arg), 
               &(args_info->delta_orig), &(args_info->delta_given),
              &(local_args_info.delta_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "delta", 'd',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */




  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}